

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

st__generator * st__init_gen(st__table *table)

{
  st__generator *gen;
  st__table *table_local;
  
  table_local = (st__table *)malloc(0x18);
  if (table_local == (st__table *)0x0) {
    table_local = (st__table *)0x0;
  }
  else {
    table_local->compare = (st__compare_func_type)table;
    table_local->hash = (st__hash_func_type)0x0;
    table_local->num_bins = 0;
  }
  return (st__generator *)table_local;
}

Assistant:

st__generator *
 st__init_gen( st__table *table)
{
    st__generator *gen;

    gen = ABC_ALLOC( st__generator, 1);
    if (gen == NULL) {
    return NULL;
    }
    gen->table = table;
    gen->entry = NULL;
    gen->index = 0;
    return gen;
}